

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25c77e::dummy::~dummy(dummy *this)

{
  runtime_error *this_00;
  string sStack_38;
  
  if (this->alive == true) {
    this->alive = false;
    (anonymous_namespace)::dummy::instances_count =
         (anonymous_namespace)::dummy::instances_count + -1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  burst::literals::operator____u8s_abi_cxx11_(&sStack_38,anon_var_dwarf_25d50f,0x26);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

~dummy () noexcept(false)
        {
            if (alive)
            {
                alive = false;
            }
            else
            {
                throw std::runtime_error(u8"Двойное уничтожение!"_u8s);
            }
            --instances_count;
        }